

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_constructor_definition
               (writer *w,MethodDef *method,TypeDef *type,TypeDef *factory)

{
  uint32_t *args;
  anon_class_24_3_5a693fe4 local_180;
  anon_class_8_1_89897ddb_conflict1 local_168;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  char *local_150;
  char *format;
  method_signature signature;
  string_view type_name;
  TypeDef *factory_local;
  TypeDef *type_local;
  MethodDef *method_local;
  writer *w_local;
  
  join_0x00000010_0x00000000_ = winmd::reader::TypeDef::TypeName(type);
  method_signature::method_signature((method_signature *)&format,method);
  local_150 = "    inline %::%(%) :\n        %(%)\n    {\n    }\n";
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_160,"    inline %::%(%) :\n        %(%)\n    {\n    }\n");
  local_168 = bind<&cppwinrt::write_consume_params,_cppwinrt::method_signature_&>
                        ((method_signature *)&format);
  bind<&cppwinrt::write_optimized_call_factory,_const_winmd::reader::TypeDef_&,_const_winmd::reader::TypeDef_&,_cppwinrt::method_signature_&>
            (&local_180,type,factory,(method_signature *)&format);
  args = &signature.m_return.super_row_base<winmd::reader::Param>.m_index;
  writer_base<cppwinrt::writer>::
  write<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
            (&w->super_writer_base<cppwinrt::writer>,&local_160,
             (basic_string_view<char,_std::char_traits<char>_> *)args,
             (basic_string_view<char,_std::char_traits<char>_> *)args,&local_168,
             (basic_string_view<char,_std::char_traits<char>_> *)args,&local_180);
  method_signature::~method_signature((method_signature *)&format);
  return;
}

Assistant:

static void write_constructor_definition(writer& w, MethodDef const& method, TypeDef const& type, TypeDef const& factory)
    {
        auto type_name = type.TypeName();
        method_signature signature{ method };

        auto format = R"(    inline %::%(%) :
        %(%)
    {
    }
)";

        w.write(format,
            type_name,
            type_name,
            bind<write_consume_params>(signature),
            type_name,
            bind<write_optimized_call_factory>(type, factory, signature));
    }